

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.h
# Opt level: O0

Rgba * Imf_3_4::ComputeBasePointer(Rgba *ptr,Box2i *dataWindow)

{
  Rgba *pRVar1;
  V2i *in_RSI;
  Rgba *in_RDI;
  
  pRVar1 = ComputeBasePointer(in_RDI,in_RSI,((long)in_RSI[1].x - (long)in_RSI->x) + 1,1,0);
  return pRVar1;
}

Assistant:

inline Rgba*
ComputeBasePointer (Rgba* ptr, const IMATH_NAMESPACE::Box2i& dataWindow)
{
    return ComputeBasePointer (
        ptr,
        dataWindow.min,
        static_cast<int64_t> (dataWindow.max.x) -
            static_cast<int64_t> (dataWindow.min.x) + 1);
}